

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  FieldDescriptor *this;
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  int iVar3;
  Reflection *pRVar4;
  reference ppFVar5;
  long lVar6;
  Descriptor *this_00;
  FileDescriptor *file_00;
  Message *pMVar7;
  int local_98;
  int i;
  FileDescriptor *msg_extension_file;
  Descriptor *field_msg;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  Reflection *reflection;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  bool *has_opt_codesize_extension_local;
  Options *options_local;
  FileDescriptor *file_local;
  Message *msg_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)has_opt_codesize_extension;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&reflection);
  pRVar4 = Message::GetReflection(msg);
  google::protobuf::Reflection::ListFields((Message *)pRVar4,(vector *)msg);
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&reflection);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&reflection);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      msg_local._7_1_ = false;
LAB_002a5886:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&reflection);
      return msg_local._7_1_;
    }
    ppFVar5 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    this = *ppFVar5;
    lVar6 = google::protobuf::FieldDescriptor::message_type();
    if (lVar6 != 0) {
      bVar1 = FieldDescriptor::is_extension(this);
      if (bVar1) {
        this_00 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
        file_00 = Descriptor::file(this_00);
        if (file_00 == file) {
          msg_local._7_1_ = true;
          goto LAB_002a5886;
        }
        if ((fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
           (FVar2 = GetOptimizeFor(file_00,options), FVar2 == FileOptions_OptimizeMode_CODE_SIZE)) {
          *(undefined1 *)
           fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
        }
      }
      bVar1 = FieldDescriptor::is_repeated(this);
      if (bVar1) {
        for (local_98 = 0;
            iVar3 = google::protobuf::Reflection::FieldSize
                              ((Message *)pRVar4,(FieldDescriptor *)msg), local_98 < iVar3;
            local_98 = local_98 + 1) {
          pMVar7 = (Message *)
                   google::protobuf::Reflection::GetRepeatedMessage
                             ((Message *)pRVar4,(FieldDescriptor *)msg,(int)this);
          bVar1 = HasExtensionFromFile
                            (pMVar7,file,options,
                             (bool *)fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            msg_local._7_1_ = true;
            goto LAB_002a5886;
          }
        }
      }
      else {
        pMVar7 = (Message *)
                 google::protobuf::Reflection::GetMessage
                           ((Message *)pRVar4,(FieldDescriptor *)msg,(MessageFactory *)this);
        bVar1 = HasExtensionFromFile
                          (pMVar7,file,options,
                           (bool *)fields.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          msg_local._7_1_ = true;
          goto LAB_002a5886;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}